

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

Data * __thiscall Runtime::getVar(Runtime *this,string *name)

{
  reference ppVVar1;
  Data *local_28;
  Data *result;
  iterator cursor;
  string *name_local;
  Runtime *this_local;
  
  cursor._M_node = (_Fwd_list_node_base *)name;
  result = (Data *)std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::begin(&this->varEnvs);
  local_28 = (Data *)0x0;
  while (local_28 == (Data *)0x0) {
    ppVVar1 = std::_Fwd_list_iterator<VarEnv_*>::operator*((_Fwd_list_iterator<VarEnv_*> *)&result);
    if (*ppVVar1 == (VarEnv *)0x0) {
      std::_Fwd_list_iterator<VarEnv_*>::operator++((_Fwd_list_iterator<VarEnv_*> *)&result,0);
    }
    else {
      ppVVar1 = std::_Fwd_list_iterator<VarEnv_*>::operator*
                          ((_Fwd_list_iterator<VarEnv_*> *)&result);
      local_28 = VarEnv::getVar(*ppVVar1,(string *)cursor._M_node);
    }
  }
  return local_28;
}

Assistant:

Data *Runtime::getVar(std::string &name) {
    auto cursor = varEnvs.begin();
    Data *result = NULL;
    while (result == NULL) {
        if ((*cursor) == NULL) {
            cursor++;
        } else {
            result = (*cursor)->getVar(name);
        }
    }
    return result;
}